

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O0

uint32 Mur(uint32 a,uint32 h)

{
  uint32 uVar1;
  uint in_ESI;
  int in_EDI;
  
  uVar1 = Rotate32(in_EDI * -0x3361d2af,0x11);
  uVar1 = Rotate32(uVar1 * 0x1b873593 ^ in_ESI,0x13);
  return uVar1 * 5 + 0xe6546b64;
}

Assistant:

static uint32 Mur(uint32 a, uint32 h) {
  // Helper from Murmur3 for combining two 32-bit values.
  a *= c1;
  a = Rotate32(a, 17);
  a *= c2;
  h ^= a;
  h = Rotate32(h, 19);
  return h * 5 + 0xe6546b64;
}